

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.h
# Opt level: O2

void __thiscall
CoreML::Specification::KNearestNeighborsClassifier::set_defaultstringlabel
          (KNearestNeighborsClassifier *this,char *value)

{
  LogMessage *other;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (value == (char *)0x0) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/../src/../build/format/NearestNeighbors.pb.h"
               ,0x469);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: value != NULL: ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  if (this->_oneof_case_[1] != 0x6e) {
    clear_DefaultClassLabel(this);
    this->_oneof_case_[1] = 0x6e;
    (this->DefaultClassLabel_).defaultint64label_ =
         (int64)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,value,(allocator<char> *)&local_51);
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&(this->DefaultClassLabel_).defaultstringlabel_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

inline void KNearestNeighborsClassifier::set_defaultstringlabel(const char* value) {
  GOOGLE_DCHECK(value != NULL);
  if (!has_defaultstringlabel()) {
    clear_DefaultClassLabel();
    set_has_defaultstringlabel();
    DefaultClassLabel_.defaultstringlabel_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  }
  DefaultClassLabel_.defaultstringlabel_.SetNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited(),
      ::std::string(value));
  // @@protoc_insertion_point(field_set_char:CoreML.Specification.KNearestNeighborsClassifier.defaultStringLabel)
}